

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioply.c
# Opt level: O1

int trico_read_ply(uint32_t *nr_of_vertices,float **vertices,float **vertex_normals,
                  uint32_t **vertex_colors,uint32_t *nr_of_triangles,uint32_t **triangles,
                  float **texcoords,char *filename)

{
  size_t __size;
  uint uVar1;
  float **ppfVar2;
  uint *puVar3;
  uint32_t **ppuVar4;
  uint32_t *puVar5;
  int iVar6;
  int iVar7;
  p_ply ptVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  float *pfVar12;
  long lVar13;
  uint32_t *puVar14;
  uint8_t *p_blue;
  uint8_t *p_green;
  uint8_t *p_red;
  uint32_t *p_tria_index;
  float *p_vertex_pointer_z;
  float *p_uv;
  float *p_normal_pointer_z;
  float *p_normal_pointer_y;
  float *p_normal_pointer_x;
  float *p_vertex_pointer_y;
  float *p_vertex_pointer_x;
  long local_c0;
  float **local_b8;
  uint *local_b0;
  p_ply local_a8;
  uint32_t **local_a0;
  long local_98;
  long local_90;
  uint32_t *local_88;
  uint32_t **local_80;
  uint32_t *local_78;
  float *local_70;
  uint32_t *local_68;
  float *local_60;
  float *local_58;
  float *local_50;
  float *local_48;
  float *local_40;
  float *local_38;
  
  *nr_of_vertices = 0;
  *vertices = (float *)0x0;
  *vertex_normals = (float *)0x0;
  *vertex_colors = (uint32_t *)0x0;
  *nr_of_triangles = 0;
  *triangles = (uint32_t *)0x0;
  *texcoords = (float *)0x0;
  local_a0 = vertex_colors;
  local_80 = triangles;
  ptVar8 = ply_open(filename,(p_ply_error_cb)0x0,0,(void *)0x0);
  if (ptVar8 == (p_ply)0x0) {
    return 0;
  }
  iVar6 = ply_read_header(ptVar8);
  if (iVar6 == 0) {
    return 0;
  }
  iVar6 = 0;
  local_38 = (float *)0x0;
  local_40 = (float *)0x0;
  local_70 = (float *)0x0;
  local_b8 = vertex_normals;
  local_b0 = nr_of_vertices;
  local_68 = nr_of_triangles;
  lVar9 = ply_set_read_cb(ptVar8,"vertex","x",read_vec3_coord,&local_38,0);
  lVar10 = ply_set_read_cb(ptVar8,"vertex","y",read_vec3_coord,&local_40,0);
  local_a8 = ptVar8;
  lVar11 = ply_set_read_cb(ptVar8,"vertex","z",read_vec3_coord,&local_70,0);
  ptVar8 = local_a8;
  if ((lVar9 == lVar10) && (lVar9 == lVar11)) {
    *local_b0 = (uint)lVar9;
    if (0 < lVar9) {
      pfVar12 = (float *)malloc(lVar9 * 0xc & 0x3fffffffc);
      *vertices = pfVar12;
    }
    ptVar8 = local_a8;
    local_38 = *vertices;
    local_40 = local_38 + 1;
    local_70 = local_38 + 2;
    local_48 = (float *)0x0;
    local_50 = (float *)0x0;
    local_58 = (float *)0x0;
    lVar9 = ply_set_read_cb(local_a8,"vertex","nx",read_vec3_coord,&local_48,0);
    lVar10 = ply_set_read_cb(ptVar8,"vertex","ny",read_vec3_coord,&local_50,0);
    lVar11 = ply_set_read_cb(ptVar8,"vertex","nz",read_vec3_coord,&local_58,0);
    puVar3 = local_b0;
    ppfVar2 = local_b8;
    if (((lVar9 != lVar10) || (lVar9 != lVar11)) || ((lVar9 != 0 && (*local_b0 != (uint)lVar9)))) {
      if (*local_b0 != 0) {
        free(*vertices);
        *vertices = (float *)0x0;
        *puVar3 = 0;
      }
LAB_0010be8e:
      ply_close(ptVar8);
      return 0;
    }
    if (0 < lVar9) {
      pfVar12 = (float *)malloc((ulong)(*local_b0 * 3) << 2);
      *ppfVar2 = pfVar12;
    }
    ptVar8 = local_a8;
    local_48 = *ppfVar2;
    local_50 = local_48 + 1;
    local_58 = local_48 + 2;
    local_88 = (uint32_t *)0x0;
    local_90 = 0;
    local_98 = 0;
    local_c0 = 0;
    lVar9 = ply_set_read_cb(local_a8,"vertex","red",read_color,&local_88,0);
    lVar10 = ply_set_read_cb(ptVar8,"vertex","green",read_color,&local_90,0);
    lVar11 = ply_set_read_cb(ptVar8,"vertex","blue",read_color,&local_98,0);
    lVar13 = ply_set_read_cb(ptVar8,"vertex","alpha",read_color,&local_c0,0);
    puVar5 = local_68;
    if (lVar9 == 0) {
      lVar9 = ply_set_read_cb(ptVar8,"vertex","r",read_color,&local_88,0);
    }
    if (lVar10 == 0) {
      lVar10 = ply_set_read_cb(ptVar8,"vertex","g",read_color,&local_90,0);
    }
    if (lVar11 == 0) {
      lVar11 = ply_set_read_cb(ptVar8,"vertex","b",read_color,&local_98,0);
    }
    puVar3 = local_b0;
    if (lVar13 == 0) {
      lVar13 = ply_set_read_cb(ptVar8,"vertex","a",read_color,&local_c0,0);
    }
    if (lVar9 == 0) {
      lVar9 = ply_set_read_cb(ptVar8,"vertex","diffuse_red",read_color,&local_88,0);
    }
    if (lVar10 == 0) {
      lVar10 = ply_set_read_cb(ptVar8,"vertex","diffuse_green",read_color,&local_90,0);
    }
    if (lVar11 == 0) {
      lVar11 = ply_set_read_cb(ptVar8,"vertex","diffuse_blue",read_color,&local_98,0);
    }
    if (lVar13 == 0) {
      lVar13 = ply_set_read_cb(ptVar8,"vertex","diffuse_alpha",read_color,&local_c0,0);
    }
    if ((0 < lVar13 || 0 < lVar11) || (0 < lVar10 || 0 < lVar9)) {
      if ((((lVar9 != 0) && (*puVar3 != (uint)lVar9)) ||
          (((lVar10 != 0 && (*puVar3 != (uint)lVar10)) ||
           ((lVar11 != 0 && (*puVar3 != (uint)lVar11)))))) ||
         ((lVar13 != 0 && (*puVar3 != (uint)lVar13)))) {
        if (*puVar3 != 0) {
          free(*vertices);
          ppfVar2 = local_b8;
          free(*local_b8);
          *vertices = (float *)0x0;
          *ppfVar2 = (float *)0x0;
          *puVar3 = 0;
        }
        goto LAB_0010be8e;
      }
      uVar1 = *puVar3;
      __size = (ulong)uVar1 * 4;
      puVar14 = (uint32_t *)malloc(__size);
      *local_a0 = puVar14;
      if ((ulong)uVar1 != 0) {
        memset(puVar14,0xff,__size);
      }
    }
    local_88 = *local_a0;
    local_90 = (long)local_88 + 1;
    local_98 = (long)local_88 + 2;
    local_c0 = (long)local_88 + 3;
    local_78 = (uint32_t *)0x0;
    lVar9 = ply_set_read_cb(ptVar8,"face","vertex_indices",read_face,&local_78,0);
    if (lVar9 == 0) {
      lVar9 = ply_set_read_cb(ptVar8,"face","vertex_index",read_face,&local_78,0);
    }
    ppuVar4 = local_80;
    *puVar5 = (uint32_t)lVar9;
    if (0 < lVar9) {
      puVar14 = (uint32_t *)malloc(lVar9 * 0xc & 0x3fffffffc);
      *ppuVar4 = puVar14;
    }
    local_78 = *ppuVar4;
    local_60 = (float *)0x0;
    lVar9 = ply_set_read_cb(ptVar8,"face","texcoord",read_texcoord,&local_60,0);
    if ((lVar9 == 0) || (*puVar5 == (uint32_t)lVar9)) {
      if (0 < lVar9) {
        pfVar12 = (float *)malloc((ulong)(*puVar5 * 6) << 2);
        *texcoords = pfVar12;
      }
      local_60 = *texcoords;
      iVar7 = ply_read(ptVar8);
      iVar6 = 1;
      if (iVar7 == 0) {
        return 0;
      }
    }
    else {
      if (*puVar3 != 0) {
        free(*vertices);
        ppfVar2 = local_b8;
        free(*local_b8);
        ppuVar4 = local_a0;
        free(*local_a0);
        *vertices = (float *)0x0;
        *ppfVar2 = (float *)0x0;
        *ppuVar4 = (uint32_t *)0x0;
        *puVar3 = 0;
      }
      ppuVar4 = local_80;
      iVar6 = 0;
      if (*puVar5 != 0) {
        free(*local_80);
        *ppuVar4 = (uint32_t *)0x0;
        *puVar5 = 0;
      }
    }
  }
  ply_close(ptVar8);
  return iVar6;
}

Assistant:

int trico_read_ply(uint32_t* nr_of_vertices,
  float** vertices,
  float** vertex_normals,
  uint32_t** vertex_colors,
  uint32_t* nr_of_triangles,
  uint32_t** triangles,
  float** texcoords,
  const char* filename)
  {
  *nr_of_vertices = 0;
  *vertices = NULL;
  *vertex_normals = NULL;
  *vertex_colors = NULL;
  *nr_of_triangles = 0;
  *triangles = NULL;
  *texcoords = NULL;

  p_ply ply = ply_open(filename, NULL, 0, NULL);
  if (!ply)
    return 0;
  if (!ply_read_header(ply))
    return 0;

  float* p_vertex_pointer_x = NULL;
  float* p_vertex_pointer_y = NULL;
  float* p_vertex_pointer_z = NULL;

  long nvertices_x = ply_set_read_cb(ply, "vertex", "x", read_vec3_coord, (void*)(&p_vertex_pointer_x), 0);
  long nvertices_y = ply_set_read_cb(ply, "vertex", "y", read_vec3_coord, (void*)(&p_vertex_pointer_y), 0);
  long nvertices_z = ply_set_read_cb(ply, "vertex", "z", read_vec3_coord, (void*)(&p_vertex_pointer_z), 0);

  if ((nvertices_x != nvertices_y) || (nvertices_x != nvertices_z))
    {
    ply_close(ply);
    return 0;
    }

  *nr_of_vertices = (uint32_t)nvertices_x;

  if (nvertices_x > 0)
    *vertices = (float*)trico_malloc(*nr_of_vertices * 3 * sizeof(float));
  p_vertex_pointer_x = (float*)(*vertices);
  p_vertex_pointer_y = p_vertex_pointer_x + 1;
  p_vertex_pointer_z = p_vertex_pointer_x + 2;

  float* p_normal_pointer_x = NULL;
  float* p_normal_pointer_y = NULL;
  float* p_normal_pointer_z = NULL;

  long nnormals_x = ply_set_read_cb(ply, "vertex", "nx", read_vec3_coord, (void*)(&p_normal_pointer_x), 0);
  long nnormals_y = ply_set_read_cb(ply, "vertex", "ny", read_vec3_coord, (void*)(&p_normal_pointer_y), 0);
  long nnormals_z = ply_set_read_cb(ply, "vertex", "nz", read_vec3_coord, (void*)(&p_normal_pointer_z), 0);

  if ((nnormals_x != nnormals_y) || (nnormals_x != nnormals_z) || (nnormals_x && ((uint32_t)nnormals_x != *nr_of_vertices)))
    {
    if (*nr_of_vertices)
      {
      free(*vertices);
      *vertices = NULL;
      *nr_of_vertices = 0;
      }
    ply_close(ply);
    return 0;
    }

  if (nnormals_x > 0)
    *vertex_normals = (float*)trico_malloc(*nr_of_vertices * 3 * sizeof(float));
  p_normal_pointer_x = (float*)(*vertex_normals);
  p_normal_pointer_y = p_normal_pointer_x + 1;
  p_normal_pointer_z = p_normal_pointer_x + 2;

  uint8_t* p_red = NULL;
  uint8_t* p_green = NULL;
  uint8_t* p_blue = NULL;
  uint8_t* p_alpha = NULL;

  long nred = ply_set_read_cb(ply, "vertex", "red", read_color, (void*)(&p_red), 0);
  long ngreen = ply_set_read_cb(ply, "vertex", "green", read_color, (void*)(&p_green), 0);
  long nblue = ply_set_read_cb(ply, "vertex", "blue", read_color, (void*)(&p_blue), 0);
  long nalpha = ply_set_read_cb(ply, "vertex", "alpha", read_color, (void*)(&p_alpha), 0);

  if (nred == 0)
    nred = ply_set_read_cb(ply, "vertex", "r", read_color, (void*)(&p_red), 0);
  if (ngreen == 0)
    ngreen = ply_set_read_cb(ply, "vertex", "g", read_color, (void*)(&p_green), 0);
  if (nblue == 0)
    nblue = ply_set_read_cb(ply, "vertex", "b", read_color, (void*)(&p_blue), 0);
  if (nalpha == 0)
    nalpha = ply_set_read_cb(ply, "vertex", "a", read_color, (void*)(&p_alpha), 0);

  if (nred == 0)
    nred = ply_set_read_cb(ply, "vertex", "diffuse_red", read_color, (void*)(&p_red), 0);
  if (ngreen == 0)
    ngreen = ply_set_read_cb(ply, "vertex", "diffuse_green", read_color, (void*)(&p_green), 0);
  if (nblue == 0)
    nblue = ply_set_read_cb(ply, "vertex", "diffuse_blue", read_color, (void*)(&p_blue), 0);
  if (nalpha == 0)
    nalpha = ply_set_read_cb(ply, "vertex", "diffuse_alpha", read_color, (void*)(&p_alpha), 0);

  if (nred > 0 || ngreen > 0 || nblue > 0 || nalpha > 0)
    {
    if ((nred && ((uint32_t)nred != *nr_of_vertices)) || (ngreen && ((uint32_t)ngreen != *nr_of_vertices)) || (nblue && ((uint32_t)nblue != *nr_of_vertices)) || (nalpha && ((uint32_t)nalpha != *nr_of_vertices)))
      {
      if (*nr_of_vertices)
        {
        free(*vertices);
        free(*vertex_normals);
        *vertices = NULL;
        *vertex_normals = NULL;
        *nr_of_vertices = 0;
        }
      ply_close(ply);
      return 0;
      }
    *vertex_colors = (uint32_t*)trico_malloc(*nr_of_vertices * sizeof(uint32_t));
    uint32_t* p_clr = *vertex_colors;
    for (uint32_t c = 0; c < *nr_of_vertices; ++c)
      *p_clr++ = 0xffffffff;
    }

  p_red = (uint8_t*)(*vertex_colors);
  p_green = p_red + 1;
  p_blue = p_red + 2;
  p_alpha = p_red + 3;

  uint32_t* p_tria_index = NULL;

  long ntriangles = ply_set_read_cb(ply, "face", "vertex_indices", read_face, (void*)(&p_tria_index), 0);
  if (ntriangles == 0)
    ntriangles = ply_set_read_cb(ply, "face", "vertex_index", read_face, (void*)(&p_tria_index), 0);

  *nr_of_triangles = (uint32_t)ntriangles;

  if (ntriangles > 0)
    *triangles = (uint32_t*)trico_malloc(*nr_of_triangles * 3 * sizeof(uint32_t));

  p_tria_index = (uint32_t*)(*triangles);

  float* p_uv = NULL;

  long ntexcoords = ply_set_read_cb(ply, "face", "texcoord", read_texcoord, (void*)(&p_uv), 0);

  if (ntexcoords && ((uint32_t)ntexcoords != *nr_of_triangles))
    {
    if (*nr_of_vertices)
      {
      free(*vertices);
      free(*vertex_normals);
      free(*vertex_colors);
      *vertices = NULL;
      *vertex_normals = NULL;
      *vertex_colors = NULL;
      *nr_of_vertices = 0;
      }
    if (*nr_of_triangles)
      {
      free(*triangles);
      *triangles = NULL;
      *nr_of_triangles = 0;
      }
    ply_close(ply);
    return 0;
    }

  if (ntexcoords > 0)
    *texcoords = (float*)trico_malloc(*nr_of_triangles * 6 * sizeof(float));

  p_uv = (float*)(*texcoords);

  if (!ply_read(ply))
    return 0;

  ply_close(ply);

  return 1;
  }